

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O0

PublicPrivateRequiredPair libcellml::publicAndOrPrivateInterfaceTypeRequired(VariablePtr *variable)

{
  bool bVar1;
  PublicPrivateRequiredPair PVar2;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  byte local_81;
  byte local_73;
  bool local_72;
  bool local_71;
  int local_70;
  bool local_6a;
  bool local_69;
  undefined1 local_68 [8];
  ParentedEntityPtr componentOfEquivalentVariable;
  undefined1 local_48 [8];
  ParentedEntityPtr componentOfVariable;
  VariablePtr equivalentVariable;
  size_t index;
  __shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Stack_18;
  PublicPrivateRequiredPair pair;
  VariablePtr *variable_local;
  PublicPrivateRequiredPair PVar3;
  
  index._5_1_ = 0;
  index._4_1_ = 0;
  p_Stack_18 = (__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )variable;
  index._6_2_ = std::make_pair<bool,bool>((bool *)((long)&index + 5),(bool *)((long)&index + 4));
  equivalentVariable.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  do {
    peVar4 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(p_Stack_18);
    p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             Variable::equivalentVariableCount(peVar4);
    local_73 = 0;
    if (equivalentVariable.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi < p_Var5) {
      local_81 = 0;
      if (((ushort)index._6_2_ & 1) != 0) {
        local_81 = index._7_1_;
      }
      local_73 = local_81 ^ 0xff;
    }
    if ((local_73 & 1) == 0) {
      PVar2.first = index._6_1_;
      PVar2.second = index._7_1_;
      return PVar2;
    }
    peVar4 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(p_Stack_18);
    Variable::equivalentVariable
              ((Variable *)
               &componentOfVariable.
                super___shared_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(size_t)peVar4);
    std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->(p_Stack_18);
    ParentedEntity::parent((ParentedEntity *)local_48);
    std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )&componentOfVariable.
                 super___shared_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount);
    ParentedEntity::parent((ParentedEntity *)local_68);
    bVar1 = std::operator==((shared_ptr<libcellml::ParentedEntity> *)local_68,(nullptr_t)0x0);
    if (bVar1) {
      local_69 = false;
      local_6a = false;
      variable_local._6_2_ = std::make_pair<bool,bool>(&local_69,&local_6a);
      local_70 = 1;
    }
    else {
      bVar1 = areEntitiesSiblings((ParentedEntityPtr *)local_48,(ParentedEntityPtr *)local_68);
      if ((bVar1) ||
         (bVar1 = isEntityChildOf((ParentedEntityPtr *)local_48,(ParentedEntityPtr *)local_68),
         bVar1)) {
        index._6_2_ = (pair<bool,_bool>)CONCAT11(index._7_1_,true);
      }
      else {
        bVar1 = isEntityChildOf((ParentedEntityPtr *)local_68,(ParentedEntityPtr *)local_48);
        if (!bVar1) {
          local_71 = false;
          local_72 = false;
          variable_local._6_2_ = std::make_pair<bool,bool>(&local_71,&local_72);
          local_70 = 1;
          goto LAB_0035ed4c;
        }
        index._6_2_ = (pair<bool,_bool>)CONCAT11(true,index._6_1_);
      }
      local_70 = 0;
    }
LAB_0035ed4c:
    std::shared_ptr<libcellml::ParentedEntity>::~shared_ptr
              ((shared_ptr<libcellml::ParentedEntity> *)local_68);
    std::shared_ptr<libcellml::ParentedEntity>::~shared_ptr
              ((shared_ptr<libcellml::ParentedEntity> *)local_48);
    std::shared_ptr<libcellml::Variable>::~shared_ptr
              ((shared_ptr<libcellml::Variable> *)
               &componentOfVariable.
                super___shared_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    if (local_70 != 0) {
      PVar3.first = variable_local._6_1_;
      PVar3.second = variable_local._7_1_;
      return PVar3;
    }
    equivalentVariable.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         ((long)&(equivalentVariable.
                  super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi)->_vptr__Sp_counted_base + 1);
  } while( true );
}

Assistant:

PublicPrivateRequiredPair publicAndOrPrivateInterfaceTypeRequired(const VariablePtr &variable)
{
    PublicPrivateRequiredPair pair = std::make_pair(false, false);
    for (size_t index = 0; index < variable->equivalentVariableCount() && !(pair.first && pair.second); ++index) {
        auto equivalentVariable = variable->equivalentVariable(index);
        auto componentOfVariable = variable->parent();
        auto componentOfEquivalentVariable = equivalentVariable->parent();
        if (componentOfEquivalentVariable == nullptr) {
            return std::make_pair(false, false);
        }
        if (areEntitiesSiblings(componentOfVariable, componentOfEquivalentVariable)
            || isEntityChildOf(componentOfVariable, componentOfEquivalentVariable)) {
            pair.first = true;
        } else if (isEntityChildOf(componentOfEquivalentVariable, componentOfVariable)) {
            pair.second = true;
        } else {
            return std::make_pair(false, false);
        }
    }
    return pair;
}